

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceMemoryVkImpl.cpp
# Opt level: O0

Bool __thiscall
Diligent::DeviceMemoryVkImpl::IsCompatible(DeviceMemoryVkImpl *this,IDeviceObject *pResource)

{
  bool bVar1;
  VulkanLogicalDevice *this_00;
  VkImage vkImage;
  BufferVkImpl *this_01;
  VkBuffer vkBuffer;
  Char *Message;
  undefined1 local_a8 [8];
  string msg;
  uint local_78;
  BufferVkImpl *pBuffVk;
  RefCntAutoPtr<Diligent::IBufferVk> pBuffer;
  VkMemoryRequirements local_50;
  TextureVkImpl *local_38;
  TextureVkImpl *pTexVk;
  RefCntAutoPtr<Diligent::ITextureVk> pTexture;
  uint32_t memoryTypeBits;
  VulkanLogicalDevice *LogicalDevice;
  IDeviceObject *pResource_local;
  DeviceMemoryVkImpl *this_local;
  
  this_00 = RenderDeviceVkImpl::GetLogicalDevice
                      ((this->super_DeviceMemoryBase<Diligent::EngineVkImplTraits>).
                       super_DeviceObjectBase<Diligent::IDeviceMemoryVk,_Diligent::RenderDeviceVkImpl,_Diligent::DeviceMemoryDesc>
                       .m_pDevice);
  pTexture.m_pObject._4_4_ = 0;
  RefCntAutoPtr<Diligent::ITextureVk>::RefCntAutoPtr
            ((RefCntAutoPtr<Diligent::ITextureVk> *)&pTexVk,&pResource->super_IObject,
             (INTERFACE_ID *)IID_TextureVk);
  bVar1 = Diligent::RefCntAutoPtr::operator_cast_to_bool((RefCntAutoPtr *)&pTexVk);
  if (bVar1) {
    local_38 = RefCntAutoPtr<Diligent::ITextureVk>::ConstPtr<Diligent::TextureVkImpl>
                         ((RefCntAutoPtr<Diligent::ITextureVk> *)&pTexVk);
    vkImage = TextureVkImpl::GetVkImage(local_38);
    VulkanUtilities::VulkanLogicalDevice::GetImageMemoryRequirements(&local_50,this_00,vkImage);
    pTexture.m_pObject._4_4_ = local_50.memoryTypeBits;
  }
  else {
    RefCntAutoPtr<Diligent::IBufferVk>::RefCntAutoPtr
              ((RefCntAutoPtr<Diligent::IBufferVk> *)&pBuffVk,&pResource->super_IObject,
               (INTERFACE_ID *)IID_BufferVk);
    bVar1 = Diligent::RefCntAutoPtr::operator_cast_to_bool((RefCntAutoPtr *)&pBuffVk);
    if (bVar1) {
      this_01 = RefCntAutoPtr<Diligent::IBufferVk>::ConstPtr<Diligent::BufferVkImpl>
                          ((RefCntAutoPtr<Diligent::IBufferVk> *)&pBuffVk);
      vkBuffer = BufferVkImpl::GetVkBuffer(this_01);
      VulkanUtilities::VulkanLogicalDevice::GetBufferMemoryRequirements
                ((VkMemoryRequirements *)((long)&msg.field_2 + 8),this_00,vkBuffer);
      pTexture.m_pObject._4_4_ = local_78;
    }
    else {
      FormatString<char[26]>((string *)local_a8,(char (*) [26])"unsupported resource type");
      Message = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (Message,"IsCompatible",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceMemoryVkImpl.cpp"
                 ,0xae);
      std::__cxx11::string::~string((string *)local_a8);
    }
    RefCntAutoPtr<Diligent::IBufferVk>::~RefCntAutoPtr
              ((RefCntAutoPtr<Diligent::IBufferVk> *)&pBuffVk);
  }
  RefCntAutoPtr<Diligent::ITextureVk>::~RefCntAutoPtr
            ((RefCntAutoPtr<Diligent::ITextureVk> *)&pTexVk);
  return (pTexture.m_pObject._4_4_ & 1 << ((byte)this->m_MemoryTypeIndex & 0x1f)) != 0;
}

Assistant:

Bool DeviceMemoryVkImpl::IsCompatible(IDeviceObject* pResource) const
{
    const auto& LogicalDevice = m_pDevice->GetLogicalDevice();

    uint32_t memoryTypeBits = 0;
    if (RefCntAutoPtr<ITextureVk> pTexture{pResource, IID_TextureVk})
    {
        const auto* pTexVk = pTexture.ConstPtr<TextureVkImpl>();
        memoryTypeBits     = LogicalDevice.GetImageMemoryRequirements(pTexVk->GetVkImage()).memoryTypeBits;
    }
    else if (RefCntAutoPtr<IBufferVk> pBuffer{pResource, IID_BufferVk})
    {
        const auto* pBuffVk = pBuffer.ConstPtr<BufferVkImpl>();
        memoryTypeBits      = LogicalDevice.GetBufferMemoryRequirements(pBuffVk->GetVkBuffer()).memoryTypeBits;
    }
    else
    {
        UNEXPECTED("unsupported resource type");
    }
    return (memoryTypeBits & (1u << m_MemoryTypeIndex)) != 0;
}